

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::GraphicsPipelineStateCreateInfoX::Clear(GraphicsPipelineStateCreateInfoX *this)

{
  GraphicsPipelineStateCreateInfoX CleanDesc;
  GraphicsPipelineStateCreateInfoX GStack_2c8;
  
  GraphicsPipelineStateCreateInfoX(&GStack_2c8);
  std::swap<Diligent::GraphicsPipelineStateCreateInfoX>(this,&GStack_2c8);
  ~GraphicsPipelineStateCreateInfoX(&GStack_2c8);
  return this;
}

Assistant:

GraphicsPipelineStateCreateInfoX& Clear()
    {
        GraphicsPipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }